

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O1

opj_pi_iterator_t * pi_create_decode_v2(opj_image_t *p_image,opj_cp_v2_t *p_cp,OPJ_UINT32 p_tile_no)

{
  uint uVar1;
  OPJ_PROG_ORDER OVar2;
  opj_pi_resolution_t *poVar3;
  OPJ_UINT32 *pOVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  OPJ_UINT32 **__ptr;
  OPJ_UINT32 **p_resolutions;
  opj_pi_iterator_t *p_pi;
  short *__s;
  uint uVar7;
  OPJ_UINT32 OVar8;
  ulong uVar9;
  OPJ_UINT32 *p_tx0;
  int iVar10;
  OPJ_UINT32 **ppOVar11;
  long lVar12;
  int iVar13;
  int *piVar14;
  int iVar15;
  opj_pi_comp_t *poVar16;
  opj_pi_iterator_t *poVar17;
  ulong uVar18;
  opj_image_comp_t *poVar19;
  opj_tcp_v2_t *poVar20;
  int iVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  OPJ_INT32 l_ty1;
  OPJ_INT32 l_ty0;
  OPJ_INT32 l_tx1;
  OPJ_INT32 l_tx0;
  opj_image_comp_t *local_58;
  ulong local_50;
  opj_tcp_v2_t *local_48;
  OPJ_UINT32 l_dy_min;
  OPJ_UINT32 l_dx_min;
  OPJ_UINT32 l_max_prec;
  OPJ_UINT32 l_max_res;
  
  poVar20 = p_cp->tcps;
  local_50 = (ulong)poVar20[p_tile_no].numpocs;
  uVar6 = p_image->numcomps;
  __ptr = (OPJ_UINT32 **)malloc((ulong)(uVar6 * 0x84) << 2);
  if (__ptr != (OPJ_UINT32 **)0x0) {
    p_resolutions = (OPJ_UINT32 **)malloc((ulong)uVar6 << 3);
    if (p_resolutions != (OPJ_UINT32 **)0x0) {
      p_pi = pi_create(p_image,p_cp,p_tile_no);
      auVar5 = _DAT_00219ba0;
      if (p_pi != (opj_pi_iterator_t *)0x0) {
        poVar20 = poVar20 + p_tile_no;
        uVar18 = (ulong)p_image->numcomps;
        if (uVar18 != 0) {
          lVar12 = uVar18 - 1;
          auVar23._8_4_ = (int)lVar12;
          auVar23._0_8_ = lVar12;
          auVar23._12_4_ = (int)((ulong)lVar12 >> 0x20);
          uVar9 = 0;
          auVar23 = auVar23 ^ _DAT_00219ba0;
          ppOVar11 = __ptr;
          auVar24 = _DAT_00219b90;
          do {
            auVar25._8_4_ = (int)ppOVar11;
            auVar25._0_8_ = ppOVar11;
            auVar25._12_4_ = (int)((ulong)ppOVar11 >> 0x20);
            auVar26 = auVar24 ^ auVar5;
            if ((bool)(~(auVar26._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar26._0_4_ ||
                        auVar23._4_4_ < auVar26._4_4_) & 1)) {
              *(OPJ_UINT32 ***)((long)p_resolutions + uVar9) = ppOVar11;
            }
            if ((auVar26._12_4_ != auVar23._12_4_ || auVar26._8_4_ <= auVar23._8_4_) &&
                auVar26._12_4_ <= auVar23._12_4_) {
              *(long *)((long)p_resolutions + uVar9 + 8) = auVar25._8_8_ + 0x210;
            }
            lVar12 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 2;
            auVar24._8_8_ = lVar12 + 2;
            ppOVar11 = ppOVar11 + 0x84;
            uVar9 = uVar9 + 0x10;
          } while ((uVar18 * 8 + 8 & 0xfffffffffffffff0) != uVar9);
        }
        uVar6 = (int)local_50 + 1;
        p_tx0 = (OPJ_UINT32 *)&l_tx0;
        get_all_encoding_parameters
                  (p_image,p_cp,p_tile_no,(OPJ_INT32 *)p_tx0,&l_tx1,&l_ty0,&l_ty1,&l_dx_min,
                   &l_dy_min,&l_max_prec,&l_max_res,p_resolutions);
        iVar21 = p_image->numcomps * l_max_prec;
        iVar13 = l_max_res * iVar21;
        uVar18 = (ulong)((poVar20->numlayers + 1) * iVar13);
        local_48 = poVar20;
        __s = (short *)calloc(uVar18,2);
        p_pi->include = __s;
        if (__s == (short *)0x0) {
          free(__ptr);
          free(p_resolutions);
          pi_destroy_v2(p_pi,uVar6);
          return (opj_pi_iterator_t *)0x0;
        }
        memset(__s,0,uVar18 * 2);
        poVar16 = p_pi->comps;
        local_58 = p_image->comps;
        p_pi->tx0 = l_tx0;
        p_pi->ty0 = l_ty0;
        p_pi->tx1 = l_tx1;
        p_pi->ty1 = l_ty1;
        p_pi->step_p = 1;
        p_pi->step_c = l_max_prec;
        p_pi->step_r = iVar21;
        p_pi->step_l = iVar13;
        uVar1 = p_pi->numcomps;
        if ((ulong)uVar1 != 0) {
          uVar18 = 0;
          poVar19 = local_58;
          do {
            poVar3 = poVar16->resolutions;
            pOVar4 = p_resolutions[uVar18];
            OVar8 = poVar19->dy;
            poVar16->dx = poVar19->dx;
            poVar16->dy = OVar8;
            p_tx0 = (OPJ_UINT32 *)(ulong)(uint)poVar16->numresolutions;
            if (poVar16->numresolutions != 0) {
              lVar12 = 0;
              do {
                *(undefined4 *)((long)&poVar3->pdx + lVar12) =
                     *(undefined4 *)((long)pOVar4 + lVar12);
                *(undefined4 *)((long)&poVar3->pdy + lVar12) =
                     *(undefined4 *)((long)pOVar4 + lVar12 + 4);
                *(undefined4 *)((long)&poVar3->pw + lVar12) =
                     *(undefined4 *)((long)pOVar4 + lVar12 + 8);
                *(undefined4 *)((long)&poVar3->ph + lVar12) =
                     *(undefined4 *)((long)pOVar4 + lVar12 + 0xc);
                lVar12 = lVar12 + 0x10;
                uVar7 = (int)p_tx0 - 1;
                p_tx0 = (OPJ_UINT32 *)(ulong)uVar7;
              } while (uVar7 != 0);
            }
            poVar16 = poVar16 + 1;
            poVar19 = poVar19 + 1;
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar1);
        }
        OVar8 = (OPJ_UINT32)p_tx0;
        if (1 < uVar6) {
          poVar17 = p_pi;
          iVar15 = 1;
          do {
            poVar16 = poVar17[1].comps;
            poVar17[1].tx0 = l_tx0;
            poVar17[1].ty0 = l_ty0;
            poVar17[1].tx1 = l_tx1;
            poVar17[1].ty1 = l_ty1;
            poVar17[1].step_p = 1;
            poVar17[1].step_c = l_max_prec;
            poVar17[1].step_r = iVar21;
            poVar17[1].step_l = iVar13;
            uVar6 = poVar17[1].numcomps;
            if ((ulong)uVar6 != 0) {
              uVar18 = 0;
              poVar19 = local_58;
              do {
                poVar3 = poVar16->resolutions;
                p_tx0 = p_resolutions[uVar18];
                OVar8 = poVar19->dy;
                poVar16->dx = poVar19->dx;
                poVar16->dy = OVar8;
                iVar10 = poVar16->numresolutions;
                if (iVar10 != 0) {
                  lVar12 = 0;
                  do {
                    *(undefined4 *)((long)&poVar3->pdx + lVar12) =
                         *(undefined4 *)((long)p_tx0 + lVar12);
                    *(undefined4 *)((long)&poVar3->pdy + lVar12) =
                         *(undefined4 *)((long)p_tx0 + lVar12 + 4);
                    *(undefined4 *)((long)&poVar3->pw + lVar12) =
                         *(undefined4 *)((long)p_tx0 + lVar12 + 8);
                    *(undefined4 *)((long)&poVar3->ph + lVar12) =
                         *(undefined4 *)((long)p_tx0 + lVar12 + 0xc);
                    lVar12 = lVar12 + 0x10;
                    iVar10 = iVar10 + -1;
                  } while (iVar10 != 0);
                }
                poVar16 = poVar16 + 1;
                poVar19 = poVar19 + 1;
                uVar18 = uVar18 + 1;
              } while (uVar18 != uVar6);
            }
            OVar8 = (OPJ_UINT32)p_tx0;
            poVar17[1].include = poVar17->include;
            poVar17 = poVar17 + 1;
            bVar22 = iVar15 != (int)local_50;
            iVar15 = iVar15 + 1;
          } while (bVar22);
        }
        free(__ptr);
        free(p_resolutions);
        if ((local_48->field_0x1628 & 2) != 0) {
          pi_update_decode_poc(p_pi,local_48,l_max_prec,OVar8);
          return p_pi;
        }
        if (local_48->numpocs != 0xffffffff) {
          OVar2 = local_48->prg;
          OVar8 = local_48->numlayers;
          piVar14 = &p_pi->first;
          iVar13 = local_48->numpocs + 1;
          do {
            piVar14[10] = OVar2;
            *(undefined8 *)piVar14 = 1;
            piVar14[2] = 0;
            *(undefined8 *)(piVar14 + 6) = 0;
            piVar14[4] = l_max_res;
            piVar14[5] = piVar14[0x26];
            piVar14[3] = OVar8;
            piVar14[8] = l_max_prec;
            piVar14 = piVar14 + 0x3e;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
          return p_pi;
        }
        return p_pi;
      }
      free(__ptr);
      __ptr = p_resolutions;
    }
    free(__ptr);
  }
  return (opj_pi_iterator_t *)0x0;
}

Assistant:

opj_pi_iterator_t *pi_create_decode_v2(	opj_image_t *p_image,
										opj_cp_v2_t *p_cp,
										OPJ_UINT32 p_tile_no
										)
{
	// loop
	OPJ_UINT32 pino;
	OPJ_UINT32 compno, resno;

	// to store w, h, dx and dy fro all components and resolutions
	OPJ_UINT32 * l_tmp_data;
	OPJ_UINT32 ** l_tmp_ptr;

	// encoding prameters to set
	OPJ_UINT32 l_max_res;
	OPJ_UINT32 l_max_prec;
	OPJ_INT32 l_tx0,l_tx1,l_ty0,l_ty1;
	OPJ_UINT32 l_dx_min,l_dy_min;
	OPJ_UINT32 l_bound;
	OPJ_UINT32 l_step_p , l_step_c , l_step_r , l_step_l ;
	OPJ_UINT32 l_data_stride;

	// pointers
	opj_pi_iterator_t *l_pi = 00;
	opj_tcp_v2_t *l_tcp = 00;
	const opj_tccp_t *l_tccp = 00;
	opj_pi_comp_t *l_current_comp = 00;
	opj_image_comp_t * l_img_comp = 00;
	opj_pi_iterator_t * l_current_pi = 00;
	OPJ_UINT32 * l_encoding_value_ptr = 00;

	// preconditions in debug
	assert(p_cp != 00);
	assert(p_image != 00);
	assert(p_tile_no < p_cp->tw * p_cp->th);

	// initializations
	l_tcp = &p_cp->tcps[p_tile_no];
	l_bound = l_tcp->numpocs+1;

	l_data_stride = 4 * J2K_MAXRLVLS;
	l_tmp_data = (OPJ_UINT32*)opj_malloc(
		l_data_stride * p_image->numcomps * sizeof(OPJ_UINT32));
	if
		(! l_tmp_data)
	{
		return 00;
	}
	l_tmp_ptr = (OPJ_UINT32**)opj_malloc(
		p_image->numcomps * sizeof(OPJ_UINT32 *));
	if
		(! l_tmp_ptr)
	{
		opj_free(l_tmp_data);
		return 00;
	}

	// memory allocation for pi
	l_pi = pi_create(p_image, p_cp, p_tile_no);
	if (!l_pi) {
		opj_free(l_tmp_data);
		opj_free(l_tmp_ptr);
		return 00;
	}

	l_encoding_value_ptr = l_tmp_data;
	// update pointer array
	for
		(compno = 0; compno < p_image->numcomps; ++compno)
	{
		l_tmp_ptr[compno] = l_encoding_value_ptr;
		l_encoding_value_ptr += l_data_stride;
	}
	// get encoding parameters
	get_all_encoding_parameters(p_image,p_cp,p_tile_no,&l_tx0,&l_tx1,&l_ty0,&l_ty1,&l_dx_min,&l_dy_min,&l_max_prec,&l_max_res,l_tmp_ptr);

	// step calculations
	l_step_p = 1;
	l_step_c = l_max_prec * l_step_p;
	l_step_r = p_image->numcomps * l_step_c;
	l_step_l = l_max_res * l_step_r;

	// set values for first packet iterator
	l_current_pi = l_pi;

	// memory allocation for include
	l_current_pi->include = (OPJ_INT16*) opj_calloc((l_tcp->numlayers +1) * l_step_l, sizeof(OPJ_INT16));
	if
		(!l_current_pi->include)
	{
		opj_free(l_tmp_data);
		opj_free(l_tmp_ptr);
		pi_destroy_v2(l_pi, l_bound);
		return 00;
	}
	memset(l_current_pi->include,0, (l_tcp->numlayers + 1) * l_step_l* sizeof(OPJ_INT16));

	// special treatment for the first packet iterator
	l_current_comp = l_current_pi->comps;
	l_img_comp = p_image->comps;
	l_tccp = l_tcp->tccps;

	l_current_pi->tx0 = l_tx0;
	l_current_pi->ty0 = l_ty0;
	l_current_pi->tx1 = l_tx1;
	l_current_pi->ty1 = l_ty1;

	//l_current_pi->dx = l_img_comp->dx;
	//l_current_pi->dy = l_img_comp->dy;

	l_current_pi->step_p = l_step_p;
	l_current_pi->step_c = l_step_c;
	l_current_pi->step_r = l_step_r;
	l_current_pi->step_l = l_step_l;

	/* allocation for components and number of components has already been calculated by pi_create */
	for
		(compno = 0; compno < l_current_pi->numcomps; ++compno)
	{
		opj_pi_resolution_t *l_res = l_current_comp->resolutions;
		l_encoding_value_ptr = l_tmp_ptr[compno];

		l_current_comp->dx = l_img_comp->dx;
		l_current_comp->dy = l_img_comp->dy;
		/* resolutions have already been initialized */
		for
			(resno = 0; resno < l_current_comp->numresolutions; resno++)
		{
			l_res->pdx = *(l_encoding_value_ptr++);
			l_res->pdy = *(l_encoding_value_ptr++);
			l_res->pw =  *(l_encoding_value_ptr++);
			l_res->ph =  *(l_encoding_value_ptr++);
			++l_res;
		}
		++l_current_comp;
		++l_img_comp;
		++l_tccp;
	}
	++l_current_pi;

	for
		(pino = 1 ; pino<l_bound ; ++pino )
	{
		opj_pi_comp_t *l_current_comp = l_current_pi->comps;
		opj_image_comp_t * l_img_comp = p_image->comps;
		l_tccp = l_tcp->tccps;

		l_current_pi->tx0 = l_tx0;
		l_current_pi->ty0 = l_ty0;
		l_current_pi->tx1 = l_tx1;
		l_current_pi->ty1 = l_ty1;
		//l_current_pi->dx = l_dx_min;
		//l_current_pi->dy = l_dy_min;
		l_current_pi->step_p = l_step_p;
		l_current_pi->step_c = l_step_c;
		l_current_pi->step_r = l_step_r;
		l_current_pi->step_l = l_step_l;

		/* allocation for components and number of components has already been calculated by pi_create */
		for
			(compno = 0; compno < l_current_pi->numcomps; ++compno)
		{
			opj_pi_resolution_t *l_res = l_current_comp->resolutions;
			l_encoding_value_ptr = l_tmp_ptr[compno];

			l_current_comp->dx = l_img_comp->dx;
			l_current_comp->dy = l_img_comp->dy;
			/* resolutions have already been initialized */
			for
				(resno = 0; resno < l_current_comp->numresolutions; resno++)
			{
				l_res->pdx = *(l_encoding_value_ptr++);
				l_res->pdy = *(l_encoding_value_ptr++);
				l_res->pw =  *(l_encoding_value_ptr++);
				l_res->ph =  *(l_encoding_value_ptr++);
				++l_res;
			}
			++l_current_comp;
			++l_img_comp;
			++l_tccp;
		}
		// special treatment
		l_current_pi->include = (l_current_pi-1)->include;
		++l_current_pi;
	}
	opj_free(l_tmp_data);
	l_tmp_data = 00;
	opj_free(l_tmp_ptr);
	l_tmp_ptr = 00;
	if
		(l_tcp->POC)
	{
		pi_update_decode_poc (l_pi,l_tcp,l_max_prec,l_max_res);
	}
	else
	{
		pi_update_decode_not_poc(l_pi,l_tcp,l_max_prec,l_max_res);
	}
	return l_pi;
}